

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableFormatter.cpp
# Opt level: O0

void __thiscall cali::TableFormatter::~TableFormatter(TableFormatter *this)

{
  TableFormatter *this_local;
  
  (this->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__TableFormatter_0054ece8;
  std::__shared_ptr<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->mP).
              super___shared_ptr<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2>);
  std::shared_ptr<cali::TableFormatter::TableImpl>::~shared_ptr(&this->mP);
  Formatter::~Formatter(&this->super_Formatter);
  return;
}

Assistant:

TableFormatter::~TableFormatter()
{
    mP.reset();
}